

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

Template * ctemplate::StringToTemplate(string *s,Strip strip)

{
  Template *pTVar1;
  ctemplate local_58 [32];
  TemplateString local_38;
  Strip local_14;
  string *psStack_10;
  Strip strip_local;
  string *s_local;
  
  local_14 = strip;
  psStack_10 = s;
  StringToTemplateFile(local_58,s);
  TemplateString::TemplateString(&local_38,(string *)local_58);
  pTVar1 = (Template *)ctemplate::Template::GetTemplate(&local_38,local_14);
  std::__cxx11::string::~string((string *)local_58);
  return pTVar1;
}

Assistant:

Template* StringToTemplate(const string& s, Strip strip) {
  return Template::GetTemplate(StringToTemplateFile(s), strip);
}